

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8skin.cpp
# Opt level: O2

void * rw::d3d8::skinOpen(void *o,int32 param_2,int32 param_3)

{
  DAT_001462d8 = makeSkinPipeline();
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	skinGlobals.pipelines[PLATFORM_D3D8] = makeSkinPipeline();
	return o;
}